

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxVectorBuiltin::Resolve(FxVectorBuiltin *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PType *local_30;
  FCompileContext *ctx_local;
  FxVectorBuiltin *this_local;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar2 = (*this->Self->_vptr_FxExpression[2])(this->Self,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (this->Self == (FxExpression *)0x0) {
    if (this != (FxVectorBuiltin *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    this_local = (FxVectorBuiltin *)0x0;
  }
  else {
    bVar1 = FxExpression::IsVector(this->Self);
    if (!bVar1) {
      __assert_fail("Self->IsVector()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2039,"virtual FxExpression *FxVectorBuiltin::Resolve(FCompileContext &)");
    }
    bVar1 = FName::operator==(&this->Function,NAME_Length);
    if (bVar1) {
      local_30 = (PType *)TypeFloat64;
    }
    else {
      local_30 = this->Self->ValueType;
    }
    (this->super_FxExpression).ValueType = local_30;
    this_local = this;
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxVectorBuiltin::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	assert(Self->IsVector());	// should never be created for anything else.
	ValueType = Function == NAME_Length ? TypeFloat64 : Self->ValueType;
	return this;
}